

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O2

int thrd_sleep(timespec *time_point,timespec *remaining)

{
  int iVar1;
  long lVar2;
  timespec now;
  
  iVar1 = clock_gettime(1,(timespec *)&now);
  if (iVar1 == 0) {
    for (lVar2 = ((time_point->tv_nsec - now.tv_nsec) + 500) / 1000 +
                 (time_point->tv_sec - now.tv_sec) * 1000000; 999999 < lVar2;
        lVar2 = lVar2 + -999999) {
      usleep(999999);
    }
    if (0 < lVar2) {
      usleep((__useconds_t)lVar2);
    }
    iVar1 = 0;
    if (remaining != (timespec *)0x0) {
      remaining->tv_sec = 0;
      remaining->tv_nsec = 0;
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int thrd_sleep(const struct timespec *time_point, struct timespec *remaining)
{
  struct timespec now;
#if defined(_TTHREAD_WIN32_)
  DWORD delta;
#else
  long delta;
#endif

  /* Get the current time */
  if (clock_gettime(TIME_UTC, &now) != 0)
    return -2;  // FIXME: Some specific error code?

#if defined(_TTHREAD_WIN32_)
  /* Delta in milliseconds */
  delta = (DWORD) ((time_point->tv_sec - now.tv_sec) * 1000 +
                   (time_point->tv_nsec - now.tv_nsec + 500000) / 1000000);
  if (delta > 0)
  {
    Sleep(delta);
  }
#else
  /* Delta in microseconds */
  delta = (time_point->tv_sec - now.tv_sec) * 1000000L +
          (time_point->tv_nsec - now.tv_nsec + 500L) / 1000L;

  /* On some systems, the usleep argument must be < 1000000 */
  while (delta > 999999L)
  {
    usleep(999999);
    delta -= 999999L;
  }
  if (delta > 0L)
  {
    usleep((useconds_t)delta);
  }
#endif

  /* We don't support waking up prematurely (yet) */
  if (remaining)
  {
    remaining->tv_sec = 0;
    remaining->tv_nsec = 0;
  }
  return 0;
}